

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_paramhlp.c
# Opt level: O3

ParameterError str2num(long *val,char *str)

{
  char *pcVar1;
  ParameterError PVar2;
  int *piVar3;
  long lVar4;
  size_t sVar5;
  char *endptr;
  char *local_28;
  
  if (str == (char *)0x0) {
    return PARAM_BAD_NUMERIC;
  }
  local_28 = (char *)0x0;
  piVar3 = __errno_location();
  *piVar3 = 0;
  lVar4 = strtol(str,&local_28,10);
  pcVar1 = local_28;
  PVar2 = PARAM_NUMBER_TOO_LARGE;
  if (*piVar3 != 0x22) {
    if ((local_28 != str) && (sVar5 = strlen(str), pcVar1 == str + sVar5)) {
      *val = lVar4;
      return PARAM_OK;
    }
    PVar2 = PARAM_BAD_NUMERIC;
  }
  return PVar2;
}

Assistant:

ParameterError str2num(long *val, const char *str)
{
  if(str) {
    char *endptr = NULL;
    long num;
    errno = 0;
    num = strtol(str, &endptr, 10);
    if(errno == ERANGE)
      return PARAM_NUMBER_TOO_LARGE;
    if((endptr != str) && (endptr == str + strlen(str))) {
      *val = num;
      return PARAM_OK;  /* Ok */
    }
  }
  return PARAM_BAD_NUMERIC; /* badness */
}